

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O0

Vec_Mem_t * Vec_MemAllocForTT(int nVars,int fCompl)

{
  int iVar1;
  word *pEntry;
  Vec_Mem_t *p;
  int local_2c;
  Vec_Mem_t *vTtMem;
  word *uTruth;
  int nWords;
  int Value;
  int fCompl_local;
  int nVars_local;
  
  if (nVars < 7) {
    local_2c = 1;
  }
  else {
    local_2c = 1 << ((char)nVars - 6U & 0x1f);
  }
  pEntry = (word *)malloc((long)local_2c << 3);
  p = Vec_MemAlloc(local_2c,0xc);
  Vec_MemHashAlloc(p,10000);
  memset(pEntry,0,(long)local_2c << 3);
  iVar1 = Vec_MemHashInsert(p,pEntry);
  if (iVar1 != 0) {
    __assert_fail("Value == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                  ,0x189,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  if (fCompl == 0) {
    memset(pEntry,0xaa,(long)local_2c << 3);
  }
  else {
    memset(pEntry,0x55,(long)local_2c << 3);
  }
  iVar1 = Vec_MemHashInsert(p,pEntry);
  if (iVar1 != 1) {
    __assert_fail("Value == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                  ,0x18e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  if (pEntry != (word *)0x0) {
    free(pEntry);
  }
  return p;
}

Assistant:

static inline Vec_Mem_t * Vec_MemAllocForTT( int nVars, int fCompl )
{
    int Value, nWords = (nVars <= 6 ? 1 : (1 << (nVars - 6)));
    word * uTruth = ABC_ALLOC( word, nWords ); 
    Vec_Mem_t * vTtMem = Vec_MemAlloc( nWords, 12 );
    Vec_MemHashAlloc( vTtMem, 10000 );
    memset( uTruth, 0x00, sizeof(word) * nWords );
    Value = Vec_MemHashInsert( vTtMem, uTruth ); assert( Value == 0 );
    if ( fCompl )
        memset( uTruth, 0x55, sizeof(word) * nWords );
    else
        memset( uTruth, 0xAA, sizeof(word) * nWords );
    Value = Vec_MemHashInsert( vTtMem, uTruth ); assert( Value == 1 );
    ABC_FREE( uTruth );
    return vTtMem;
}